

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_doomedmap.cpp
# Opt level: O3

void Cmd_dumpmapthings(FCommandLine *argv,APlayerPawn *who,int key)

{
  Pair *pPVar1;
  PClassActor *pPVar2;
  Node *pNVar3;
  uint uVar4;
  NameEntry *pNVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  IPair *pIVar10;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  infos;
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  local_38;
  
  local_38.Most =
       TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CountUsed(&DoomEdMap)
  ;
  local_38.Count = 0;
  local_38.Array =
       (Pair **)M_Malloc_Dbg((long)(int)local_38.Most << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x91);
  if (DoomEdMap.Size != 0) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      uVar9 = (ulong)uVar8;
      pNVar3 = DoomEdMap.Nodes + uVar9;
      while (pIVar10 = &pNVar3->Pair, *(long *)((long)(pIVar10 + -1) + 0x20) == 1) {
        uVar9 = uVar9 + 1;
        pNVar3 = (Node *)(pIVar10 + 1);
        if (DoomEdMap.Size <= uVar9) goto LAB_004d92ce;
      }
      TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
      ::Grow(&local_38,1);
      uVar8 = (int)uVar9 + 1;
      local_38.Array[local_38.Count] = (Pair *)pIVar10;
      uVar4 = local_38.Count + 1;
      local_38.Count = uVar4;
    } while (uVar8 < DoomEdMap.Size);
LAB_004d92ce:
    if (uVar4 != 0) {
      qsort(local_38.Array,(ulong)uVar4,8,sortnums);
      if (local_38.Count != 0) {
        uVar9 = 0;
        do {
          pPVar1 = local_38.Array[uVar9];
          pPVar2 = (pPVar1->Value).Type;
          if (pPVar2 == (PClassActor *)0x0) {
            lVar6 = (long)(pPVar1->Value).Special;
            uVar7 = (ulong)(uint)pPVar1->Key;
            if (0 < lVar6) {
              pNVar5 = (NameEntry *)(&DAT_0089a2b8 + lVar6 * 8);
              goto LAB_004d9350;
            }
            Printf("%6d none\n",uVar7);
          }
          else {
            uVar7 = (ulong)(uint)pPVar1->Key;
            pNVar5 = FName::NameData.NameArray +
                     (pPVar2->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
LAB_004d9350:
            Printf("%6d %s\n",uVar7,pNVar5->Text);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_38.Count);
      }
      goto LAB_004d9385;
    }
  }
  Printf("No map things registered\n");
LAB_004d9385:
  TArray<TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*,_TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::Pair_*>
  ::~TArray(&local_38);
  return;
}

Assistant:

CCMD (dumpmapthings)
{
	TArray<FDoomEdMap::Pair*> infos(DoomEdMap.CountUsed());
	FDoomEdMap::Iterator it(DoomEdMap);
	FDoomEdMap::Pair *pair;

	while (it.NextPair(pair))
	{
		infos.Push(pair);
	}

	if (infos.Size () == 0)
	{
		Printf ("No map things registered\n");
	}
	else
	{
		qsort (&infos[0], infos.Size (), sizeof(FDoomEdMap::Pair*), sortnums);

		for (unsigned i = 0; i < infos.Size (); ++i)
		{
			if (infos[i]->Value.Type != NULL)
			{
				Printf("%6d %s\n", infos[i]->Key, infos[i]->Value.Type->TypeName.GetChars());
			}
			else if (infos[i]->Value.Special > 0)
			{
				Printf("%6d %s\n", infos[i]->Key, SpecialMapthingNames[infos[i]->Value.Special - 1]);
			}
			else
			{
				Printf("%6d none\n", infos[i]->Key);
			}

		}
	}
}